

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O3

int mp3dec_ex_open(mp3dec_ex_t *dec,char *file_name,int flags)

{
  int iVar1;
  
  if (dec == (mp3dec_ex_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = mp3dec_open_file(file_name,&dec->file);
    if (iVar1 == 0) {
      iVar1 = mp3dec_ex_open_buf(dec,(dec->file).buffer,(dec->file).size,flags);
      dec->is_file = 1;
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        mp3dec_ex_close(dec);
      }
    }
  }
  return iVar1;
}

Assistant:

int mp3dec_ex_open(mp3dec_ex_t *dec, const char *file_name, int flags)
{
    int ret;
    if (!dec)
        return MP3D_E_PARAM;
    if ((ret = mp3dec_open_file(file_name, &dec->file)))
        return ret;
    return mp3dec_ex_open_mapinfo(dec, flags);
}